

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O3

int mbedtls_ecdh_read_params(mbedtls_ecdh_context *ctx,uchar **buf,uchar *end)

{
  int iVar1;
  undefined8 in_RAX;
  mbedtls_ecp_group_id local_24 [2];
  mbedtls_ecp_group_id grp_id;
  
  local_24[0] = (mbedtls_ecp_group_id)((ulong)in_RAX >> 0x20);
  iVar1 = mbedtls_ecp_tls_read_group_id(local_24,buf,(long)end - (long)*buf);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecdh_setup(ctx,local_24[0]);
    if ((iVar1 == 0) && (iVar1 = -0x4f80, ctx->var == MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0)) {
      iVar1 = mbedtls_ecp_tls_read_point
                        (&(ctx->ctx).mbed_ecdh.grp,&(ctx->ctx).mbed_ecdh.Qp,buf,
                         (long)end - (long)*buf);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdh_read_params(mbedtls_ecdh_context *ctx,
                             const unsigned char **buf,
                             const unsigned char *end)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_group_id grp_id;
    if ((ret = mbedtls_ecp_tls_read_group_id(&grp_id, buf, end - *buf))
        != 0) {
        return ret;
    }

    if ((ret = mbedtls_ecdh_setup(ctx, grp_id)) != 0) {
        return ret;
    }

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    return ecdh_read_params_internal(ctx, buf, end);
#else
    switch (ctx->var) {
#if defined(MBEDTLS_ECDH_VARIANT_EVEREST_ENABLED)
        case MBEDTLS_ECDH_VARIANT_EVEREST:
            return mbedtls_everest_read_params(&ctx->ctx.everest_ecdh,
                                               buf, end);
#endif
        case MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0:
            return ecdh_read_params_internal(&ctx->ctx.mbed_ecdh,
                                             buf, end);
        default:
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }
#endif
}